

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int strarray_append(strarray *array,char *string)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *ptr;
  size_t new_length;
  size_t length;
  char *string_local;
  strarray *array_local;
  
  sVar1 = strlen(string);
  sVar2 = array->length + sVar1 + 1;
  pcVar3 = (char *)realloc(array->value,sVar2 + 0x3f & 0xffffffffffffffc0);
  if (pcVar3 == (char *)0x0) {
    array_local._4_4_ = -1;
  }
  else {
    memcpy(pcVar3 + array->length,string,sVar1 + 1);
    array->value = pcVar3;
    array->length = sVar2;
    array_local._4_4_ = 0;
  }
  return array_local._4_4_;
}

Assistant:

int
strarray_append(struct strarray *array, const char *string) {
  size_t length, new_length;
  char *ptr;

  length = strlen(string) + 1;

  new_length = array->length + length;
  ptr = realloc(array->value, STRARRAY_MEMSIZE(new_length));
  if (ptr == NULL) {
    return -1;
  }

  memcpy(ptr + array->length, string, length);
  array->value = ptr;
  array->length = new_length;
  return 0;
}